

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timewarp-file.c
# Opt level: O3

int main(void)

{
  puts(
      "\n****************************************************************\n  This example program was compiled without libsndfile \n  (https://github.com/libsndfile/libsndfile/).\n  It is therefore completely broken and non-functional.\n****************************************************************\n\n"
      );
  return 0;
}

Assistant:

int
main (void)
{	puts (
		"\n"
		"****************************************************************\n"
		"  This example program was compiled without libsndfile \n"
		"  (https://github.com/libsndfile/libsndfile/).\n"
		"  It is therefore completely broken and non-functional.\n"
		"****************************************************************\n"
		"\n"
		) ;

	return 0 ;
}